

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O3

void __thiscall
ZCC_OpInfoType::AddProto
          (ZCC_OpInfoType *this,PType *res,PType *ltype,PType *rtype,EvalConst2op evalconst)

{
  ZCC_OpProto *pZVar1;
  
  if (ltype != (PType *)0x0) {
    pZVar1 = (ZCC_OpProto *)operator_new(0x28);
    pZVar1->ResType = res;
    pZVar1->Type1 = ltype;
    pZVar1->Type2 = rtype;
    (pZVar1->field_4).EvalConst2 = evalconst;
    pZVar1->Next = this->Protos;
    this->Protos = pZVar1;
    return;
  }
  __assert_fail("ltype != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_expr.cpp"
                ,0x44,"void ZCC_OpInfoType::AddProto(PType *, PType *, PType *, EvalConst2op)");
}

Assistant:

void ZCC_OpInfoType::AddProto(PType *res, PType *ltype, PType *rtype, EvalConst2op evalconst)
{
	assert(ltype != NULL);
	ZCC_OpProto *proto = new ZCC_OpProto(res, ltype, rtype);
	proto->EvalConst2 = evalconst;
	proto->Next = Protos;
	Protos = proto;
}